

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O2

bool __thiscall DepsLog::UpdateDeps(DepsLog *this,int out_id,Deps *deps)

{
  vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_> *this_00;
  Deps *this_01;
  pointer ppDVar1;
  
  this_00 = &this->deps_;
  ppDVar1 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->deps_).
                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1) >> 3) <= out_id
     ) {
    std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::resize
              (this_00,(long)(out_id + 1));
    ppDVar1 = (this_00->super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  this_01 = ppDVar1[out_id];
  if (this_01 != (Deps *)0x0) {
    Deps::~Deps(this_01);
    operator_delete(this_01,0x18);
    ppDVar1 = (this_00->super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  ppDVar1[out_id] = deps;
  return this_01 != (Deps *)0x0;
}

Assistant:

bool DepsLog::UpdateDeps(int out_id, Deps* deps) {
  if (out_id >= (int)deps_.size())
    deps_.resize(out_id + 1);

  bool delete_old = deps_[out_id] != NULL;
  if (delete_old)
    delete deps_[out_id];
  deps_[out_id] = deps;
  return delete_old;
}